

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O0

Orphan<capnp::DynamicValue> * __thiscall
capnp::TextCodec::decode
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,TextCodec *this,StringPtr input,
          Type type,Orphanage orphanage)

{
  anon_class_24_3_d091ff59 f;
  StringPtr input_00;
  TextCodec *this_local;
  Type type_local;
  StringPtr input_local;
  Orphan<capnp::DynamicValue> *output;
  
  type_local._0_8_ = type.field_4;
  this_local = type._0_8_;
  type_local.field_4.scopeId = (uint64_t)input.content.ptr;
  Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
  input_00.content.size_ = input.content.size_;
  input_00.content.ptr = (char *)type_local.field_4.schema;
  f.orphanage = &orphanage;
  f.type = (Type *)&this_local;
  f.output = __return_storage_ptr__;
  ::(anonymous_namespace)::
  lexAndParseExpression<capnp::TextCodec::decode(kj::StringPtr,capnp::Type,capnp::Orphanage)const::__0>
            (input_00,f);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> TextCodec::decode(kj::StringPtr input, Type type, Orphanage orphanage) const {
  Orphan<DynamicValue> output;
  
  lexAndParseExpression(input, [&type, &orphanage, &output](compiler::Expression::Reader expression) {
    ThrowingErrorReporter errorReporter;
    ExternalResolver nullResolver;

    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    KJ_IF_MAYBE(value, translator.compileValue(expression, type)) {
      output = *kj::mv(value);
    } else {
      // An error should have already been given to the errorReporter.
    }
  });
  
  return output;
}